

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O0

void __thiscall CTcDataStream::write_at(CTcDataStream *this,ulong ofs,char *buf,size_t len)

{
  char *__dest;
  void *in_RCX;
  void *in_RDX;
  ulong in_RSI;
  CTcDataStream *in_RDI;
  size_t cur;
  void *local_28;
  void *local_20;
  void *local_18;
  ulong local_10;
  
  if (in_RSI == in_RDI->ofs_) {
    write(in_RDI,(int)in_RDX,in_RCX,(size_t)in_RDI);
  }
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (in_RSI + (long)in_RCX <= in_RDI->ofs_) {
    for (; local_20 != (void *)0x0; local_20 = (void *)((long)local_20 - (long)local_28)) {
      local_28 = (void *)(65000 - local_10 % 65000);
      if (local_20 < local_28) {
        local_28 = local_20;
      }
      __dest = calc_addr(in_RDI,local_10);
      memcpy(__dest,local_18,(size_t)local_28);
      local_10 = (long)local_28 + local_10;
      local_18 = (void *)((long)local_28 + (long)local_18);
    }
    return;
  }
  CTcTokenizer::throw_internal_error(0x2cee);
}

Assistant:

void CTcDataStream::write_at(ulong ofs, const char *buf, size_t len)
{
    /* if we're writing to the current offset, use the normal writer */
    if (ofs == ofs_)
        write(buf, len);
    
    /* 
     *   log an internal error, and skip writing anything, if the desired
     *   range of offsets has not been previously written 
     */
    if (ofs + len > ofs_)
        G_tok->throw_internal_error(TCERR_WRITEAT_PAST_END);

    /* write the data to each page it spans */
    while (len != 0)
    {
        size_t cur;

        /* 
         *   determine how much is left on the page containing the current
         *   starting offset 
         */
        cur = TCCS_PAGE_SIZE - (ofs % TCCS_PAGE_SIZE);

        /* 
         *   figure out how much we can copy - copy the whole remaining
         *   size, but no more than the amount remaining on this page 
         */
        if (cur > len)
            cur = len;

        /* copy the data */
        memcpy(calc_addr(ofs), buf, cur);

        /* advance past this chunk */
        len -= cur;
        ofs += cur;
        buf += cur;
    }
}